

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

void __thiscall RealCommandRunner::RealCommandRunner(RealCommandRunner *this,BuildConfig *config)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_CommandRunner)._vptr_CommandRunner = (_func_int **)&PTR__RealCommandRunner_0012cb58;
  this->config_ = config;
  SubprocessSet::SubprocessSet(&this->subprocs_);
  p_Var1 = &(this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

explicit RealCommandRunner(const BuildConfig& config) : config_(config) {}